

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agentf.c
# Opt level: O0

size_t agentf_send(Channel *chan,_Bool is_stderr,void *data,size_t length)

{
  size_t local_38;
  agentf *af;
  size_t length_local;
  void *data_local;
  _Bool is_stderr_local;
  Channel *chan_local;
  
  if (chan->vt == &agentf_channelvt) {
    bufchain_add((bufchain *)&chan[-4].initial_fixed_window_size,data,length);
    agentf_try_forward((agentf *)(chan + -4));
    if (chan[-1].vt == (ChannelVtable *)0x0) {
      local_38 = 0;
    }
    else {
      local_38 = bufchain_size((bufchain *)&chan[-4].initial_fixed_window_size);
    }
    return local_38;
  }
  __assert_fail("chan->vt == &agentf_channelvt",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/agentf.c",
                0xca,"size_t agentf_send(Channel *, _Bool, const void *, size_t)");
}

Assistant:

static size_t agentf_send(Channel *chan, bool is_stderr,
                          const void *data, size_t length)
{
    assert(chan->vt == &agentf_channelvt);
    agentf *af = container_of(chan, agentf, chan);
    bufchain_add(&af->inbuffer, data, length);
    agentf_try_forward(af);

    /*
     * We exert back-pressure on an agent forwarding client if and
     * only if we're waiting for the response to an asynchronous agent
     * request. This prevents the client running out of window while
     * receiving the _first_ message, but means that if any message
     * takes time to process, the client will be discouraged from
     * sending an endless stream of further ones after it.
     */
    return (af->pending ? bufchain_size(&af->inbuffer) : 0);
}